

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcSort.c
# Opt level: O3

Mvc_Cube_t *
Mvc_CoverSortMerge(Mvc_Cube_t *pList1,Mvc_Cube_t *pList2,Mvc_Cube_t *pMask,
                  _func_int_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr *pCompareFunc)

{
  int iVar1;
  Mvc_Cube_t *pMVar2;
  Mvc_Cube_t *pMVar3;
  Mvc_Cube_t *pMVar4;
  bool bVar5;
  Mvc_Cube_t *pList;
  Mvc_Cube_t *local_30;
  
  local_30 = (Mvc_Cube_t *)0x0;
  bVar5 = pList1 != (Mvc_Cube_t *)0x0;
  if (pList2 == (Mvc_Cube_t *)0x0 || pList1 == (Mvc_Cube_t *)0x0) {
    pMVar2 = (Mvc_Cube_t *)&local_30;
  }
  else {
    pMVar3 = (Mvc_Cube_t *)&local_30;
    pMVar4 = pList1;
    do {
      iVar1 = (*pCompareFunc)(pMVar4,pList2,pMask);
      if (iVar1 < 0) {
        pList1 = pMVar4->pNext;
        pMVar2 = pMVar4;
      }
      else {
        pMVar2 = pList2;
        pList2 = pList2->pNext;
        pList1 = pMVar4;
      }
      pMVar3->pNext = pMVar2;
      bVar5 = pList1 != (Mvc_Cube_t *)0x0;
    } while ((bVar5) && (pMVar3 = pMVar2, pMVar4 = pList1, pList2 != (Mvc_Cube_t *)0x0));
  }
  if (bVar5) {
    pList2 = pList1;
  }
  pMVar2->pNext = pList2;
  return local_30;
}

Assistant:

Mvc_Cube_t * Mvc_CoverSortMerge( Mvc_Cube_t * pList1, Mvc_Cube_t * pList2, Mvc_Cube_t * pMask, int (* pCompareFunc)(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *) )
{
    Mvc_Cube_t * pList = NULL, ** ppTail = &pList;
    Mvc_Cube_t * pCube;
    while ( pList1 && pList2 )
    {
        if ( pCompareFunc( pList1, pList2, pMask ) < 0 )
        {
            pCube = pList1;
            pList1 = Mvc_CubeReadNext(pList1);
        }
        else
        {
            pCube = pList2;
            pList2 = Mvc_CubeReadNext(pList2);
        }
        *ppTail = pCube;
        ppTail = Mvc_CubeReadNextP(pCube);
    }
    *ppTail = pList1? pList1: pList2;
    return pList;
}